

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall vm_lookup_ext::init_ext(vm_lookup_ext *this)

{
  uint uVar1;
  uint uVar2;
  vm_lookup_val *__s;
  
  uVar1 = this->bucket_cnt;
  __s = (vm_lookup_val *)this->buckets;
  if ((ulong)uVar1 != 0) {
    memset(__s,0,(ulong)uVar1 << 3);
    __s = (vm_lookup_val *)(this[1].buckets + ((ulong)(uVar1 - 1) - 4));
  }
  this->first_free = __s;
  for (uVar2 = this->value_cnt; uVar2 != 0; uVar2 = uVar2 - 1) {
    __s->nxt = __s + 1;
    (__s->key).typ = 0xd;
    (__s->val).typ = VM_EMPTY;
    __s = __s + 1;
  }
  __s[-1].nxt = (vm_lookup_val *)0x0;
  return;
}

Assistant:

void vm_lookup_ext::init_ext()
{
    uint i;
    vm_lookup_val **bucketp;
    vm_lookup_val *valp;

    /* all of the buckets are initially empty */
    for (i = bucket_cnt, bucketp = buckets ; i != 0 ; --i, ++bucketp)
        *bucketp = 0;

    /* 
     *   Initialize the value free list.  We suballocate the value entry
     *   structures out of our main allocation block; the available memory
     *   for the structures comes immediately after the last bucket, so
     *   bucketp points to the first value entry. 
     */
    valp = (vm_lookup_val *)(void *)bucketp;
    first_free = valp;
    for (first_free = valp, i = value_cnt ; i != 0 ; --i, ++valp)
    {
        /* link it into the free list */
        valp->nxt = valp + 1;

        /* mark it as empty */
        valp->key.set_empty();
        valp->val.set_empty();
    }

    /* terminate the free list at the last element */
    (valp - 1)->nxt = 0;
}